

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilSort.c
# Opt level: O3

void Abc_QuickSort2Dec_rec(word *pData,int l,int r)

{
  word wVar1;
  long lVar2;
  word wVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  ulong uVar9;
  
  if (r <= l) {
    return;
  }
LAB_00418c63:
  uVar4 = r - l;
  if ((int)uVar4 < 10) {
    if ((int)uVar4 < 1) {
      return;
    }
    uVar6 = 1;
    uVar9 = 0;
    do {
      uVar5 = uVar9 & 0xffffffff;
      uVar7 = uVar6;
      do {
        uVar8 = (uint)uVar7;
        if ((uint)pData[(long)l + uVar7] <= (uint)pData[(long)l + (long)(int)(uint)uVar5]) {
          uVar8 = (uint)uVar5;
        }
        uVar7 = uVar7 + 1;
        uVar5 = (ulong)uVar8;
      } while (uVar4 + 1 != uVar7);
      wVar3 = pData[(long)l + uVar9];
      pData[(long)l + uVar9] = pData[(long)l + (long)(int)uVar8];
      uVar9 = uVar9 + 1;
      pData[(long)l + (long)(int)uVar8] = wVar3;
      uVar6 = uVar6 + 1;
    } while (uVar9 != uVar4);
    return;
  }
  uVar9 = (ulong)(l - 1);
  wVar3 = pData[r];
  uVar6 = (ulong)(uint)r;
  do {
    uVar9 = (long)(int)uVar9;
    do {
      uVar7 = uVar9;
      wVar1 = pData[uVar7 + 1];
      uVar9 = uVar7 + 1;
    } while ((uint)wVar3 < (uint)wVar1);
    uVar5 = (long)(int)uVar6;
    do {
      lVar2 = uVar5 - 1;
      uVar6 = uVar5 - 1;
      if (l + 1 == (int)uVar5) break;
      uVar5 = uVar6;
    } while ((uint)pData[lVar2] < (uint)wVar3);
    if ((long)uVar6 <= (long)uVar9) break;
    pData[uVar9] = pData[lVar2];
    pData[uVar6] = wVar1;
  } while( true );
  pData[uVar9] = pData[r];
  pData[r] = wVar1;
  Abc_QuickSort2Dec_rec(pData,l,(int)uVar7);
  l = (int)uVar7 + 2;
  if (r <= l) {
    return;
  }
  goto LAB_00418c63;
}

Assistant:

void Abc_QuickSort2Dec_rec( word * pData, int l, int r )
{
    word v = pData[r];
    int i = l-1, j = r;
    if ( l >= r )
        return;
    assert( l < r );
    if ( r - l < 10 )
    {
        Abc_SelectSortDec( pData + l, r - l + 1 );
        return;
    }
    while ( 1 )
    {
        while ( (unsigned)pData[++i] > (unsigned)v );
        while ( (unsigned)v > (unsigned)pData[--j] )
            if ( j == l )
                break;
        if ( i >= j )
            break;
        ABC_SWAP( word, pData[i], pData[j] );
    }
    ABC_SWAP( word, pData[i], pData[r] ); 
    Abc_QuickSort2Dec_rec( pData, l, i-1 );
    Abc_QuickSort2Dec_rec( pData, i+1, r );
}